

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

VirtualInterfaceTypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::VirtualInterfaceTypeSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ParameterValueAssignmentSyntax*&,slang::syntax::DotMemberClauseSyntax*&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,
          ParameterValueAssignmentSyntax **args_3,DotMemberClauseSyntax **args_4)

{
  ParameterValueAssignmentSyntax *pPVar1;
  DotMemberClauseSyntax *pDVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  VirtualInterfaceTypeSyntax *pVVar18;
  
  pVVar18 = (VirtualInterfaceTypeSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((VirtualInterfaceTypeSyntax *)this->endPtr < pVVar18 + 1) {
    pVVar18 = (VirtualInterfaceTypeSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pVVar18 + 1);
  }
  TVar6 = args->kind;
  uVar7 = args->field_0x2;
  NVar8.raw = (args->numFlags).raw;
  uVar9 = args->rawLen;
  pIVar3 = args->info;
  TVar10 = args_1->kind;
  uVar11 = args_1->field_0x2;
  NVar12.raw = (args_1->numFlags).raw;
  uVar13 = args_1->rawLen;
  pIVar4 = args_1->info;
  TVar14 = args_2->kind;
  uVar15 = args_2->field_0x2;
  NVar16.raw = (args_2->numFlags).raw;
  uVar17 = args_2->rawLen;
  pIVar5 = args_2->info;
  pPVar1 = *args_3;
  pDVar2 = *args_4;
  (pVVar18->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = (SyntaxNode *)0x0
  ;
  (pVVar18->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind =
       VirtualInterfaceType;
  (pVVar18->virtualKeyword).kind = TVar6;
  (pVVar18->virtualKeyword).field_0x2 = uVar7;
  (pVVar18->virtualKeyword).numFlags = (NumericTokenFlags)NVar8.raw;
  (pVVar18->virtualKeyword).rawLen = uVar9;
  (pVVar18->virtualKeyword).info = pIVar3;
  (pVVar18->interfaceKeyword).kind = TVar10;
  (pVVar18->interfaceKeyword).field_0x2 = uVar11;
  (pVVar18->interfaceKeyword).numFlags = (NumericTokenFlags)NVar12.raw;
  (pVVar18->interfaceKeyword).rawLen = uVar13;
  (pVVar18->interfaceKeyword).info = pIVar4;
  (pVVar18->name).kind = TVar14;
  (pVVar18->name).field_0x2 = uVar15;
  (pVVar18->name).numFlags = (NumericTokenFlags)NVar16.raw;
  (pVVar18->name).rawLen = uVar17;
  (pVVar18->name).info = pIVar5;
  pVVar18->parameters = pPVar1;
  pVVar18->modport = pDVar2;
  if (pPVar1 != (ParameterValueAssignmentSyntax *)0x0) {
    (pPVar1->super_SyntaxNode).parent = (SyntaxNode *)pVVar18;
  }
  if (pDVar2 != (DotMemberClauseSyntax *)0x0) {
    (pDVar2->super_SyntaxNode).parent = (SyntaxNode *)pVVar18;
  }
  return pVVar18;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }